

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O2

bool __thiscall Sector::operator==(Sector *this,Sector *sector)

{
  uchar *__first1;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  bVar1 = Header::operator!=(&sector->header,&this->header);
  if (!bVar1) {
    lVar4 = (long)(sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((lVar4 == 0) &&
       ((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      return true;
    }
    if (((int)(lVar4 / 0x18) != 0) &&
       ((int)(((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18) != 0)) {
      iVar2 = data_size(sector);
      iVar3 = Header::sector_size(&sector->header);
      if (iVar3 <= iVar2) {
        iVar2 = data_size(this);
        iVar3 = Header::sector_size(&this->header);
        if (iVar3 <= iVar2) {
          __first1 = *(uchar **)
                      &(((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_start)->
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
          iVar2 = Header::sector_size(&this->header);
          bVar1 = std::__equal<true>::equal<unsigned_char>
                            (__first1,__first1 + iVar2,
                             *(uchar **)
                              &(((sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Sector::operator== (const Sector& sector) const
{
    // Headers must match
    if (sector.header != header)
        return false;

    // If neither has data it's a match
    if (sector.m_data.size() == 0 && m_data.size() == 0)
        return true;

    // Both sectors must have some data
    if (sector.copies() == 0 || copies() == 0)
        return false;

    // Both first sectors must have at least the natural size to compare
    if (sector.data_size() < sector.size() || data_size() < size())
        return false;

    // The natural data contents must match
    return std::equal(data_copy().begin(), data_copy().begin() + size(), sector.data_copy().begin());
}